

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* sentencepiece::util::StrSplitAsCSV_abi_cxx11_(string_view text)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  size_t in_RSI;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_RDI;
  char *__s;
  char *pcVar5;
  char *pcVar6;
  string buf;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  char *local_60 [4];
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_len = in_RSI;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_60,&local_40,(allocator<char> *)&local_80);
  pcVar6 = local_60[0] + local_40._M_len;
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  __s = local_60[0];
  while (__s < pcVar6) {
    if (*__s == '\"') {
      __s = __s + 1;
      pcVar4 = __s;
      pcVar5 = __s;
      while ((pcVar4 < pcVar6 &&
             ((cVar2 = *pcVar4, pcVar3 = pcVar4, cVar2 != '\"' ||
              (pcVar3 = pcVar4 + 1, pcVar1 = pcVar4 + 1, pcVar4 = pcVar3, *pcVar1 == '\"'))))) {
        *pcVar5 = cVar2;
        pcVar5 = pcVar5 + 1;
        pcVar4 = pcVar3 + 1;
      }
      local_80._M_dataplus._M_p._0_1_ = 0x2c;
      pcVar4 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         (pcVar4,pcVar6,&local_80);
    }
    else {
      local_80._M_dataplus._M_p._0_1_ = 0x2c;
      pcVar4 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         (__s,pcVar6,&local_80);
      pcVar5 = pcVar4;
    }
    *pcVar5 = '\0';
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,__s,&local_81);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(in_RDI,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    __s = pcVar4 + 1;
  }
  std::__cxx11::string::~string((string *)local_60);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::string> StrSplitAsCSV(absl::string_view text) {
  std::string buf = std::string(text);
  char *str = const_cast<char *>(buf.data());
  char *eos = str + text.size();
  char *start = nullptr;
  char *end = nullptr;

  std::vector<std::string> result;
  for (; str < eos; ++str) {
    if (*str == '"') {
      start = ++str;
      end = start;
      for (; str < eos; ++str) {
        if (*str == '"') {
          str++;
          if (*str != '"') break;
        }
        *end++ = *str;
      }
      str = std::find(str, eos, ',');
    } else {
      start = str;
      str = std::find(str, eos, ',');
      end = str;
    }
    *end = '\0';
    result.push_back(start);
  }

  return result;
}